

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,char>,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  native_formatter<double,_char,_(fmt::v11::detail::type)10> local_50;
  
  local_50.specs_.precision_ref.name.size_ = 0;
  local_50.specs_.width_ref.name.data_ = (char *)0x0;
  local_50.specs_.width_ref.name.size_ = 0;
  local_50.specs_.super_format_specs.super_basic_specs.data_ = 0x8000;
  local_50.specs_.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_50.specs_.super_format_specs._5_4_ = 0;
  local_50.specs_.super_format_specs._9_7_ = 0xffffffff000000;
  local_50.specs_.precision_ref.name.data_ = (char *)0x0;
  pcVar3 = native_formatter<double,_char,_(fmt::v11::detail::type)10>::parse(&local_50,parse_ctx);
  pcVar2 = (parse_ctx->fmt_).data_;
  (parse_ctx->fmt_).data_ = pcVar3;
  psVar1 = &(parse_ctx->fmt_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_char>,_char,_void>
  ::format<fmt::v11::context>
            ((formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_char>,_char,_void>
              *)&local_50,(view *)arg,ctx);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }